

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

timestamp_t __thiscall NeuralConsumer::getData(NeuralConsumer *this,int16_t *dest)

{
  uint uVar1;
  short *psVar2;
  size_type sVar3;
  reference pvVar4;
  uint *puVar5;
  int64_t iVar6;
  HFSubConsumer *in_RDI;
  timestamp_t tVar7;
  uint i;
  int offset;
  int16_t *src;
  short *__result;
  short *__last;
  short *__first;
  uint local_30;
  
  psVar2 = std::vector<short,_std::allocator<short>_>::data
                     ((vector<short,_std::allocator<short>_> *)0x1cf014);
  sVar3 = std::vector<short,_std::allocator<short>_>::size
                    ((vector<short,_std::allocator<short>_> *)(in_RDI + 1));
  (*(in_RDI->super_HighFreqSub)._vptr_HighFreqSub[5])(in_RDI,psVar2,sVar3 << 1);
  psVar2 = std::vector<short,_std::allocator<short>_>::data
                     ((vector<short,_std::allocator<short>_> *)0x1cf051);
  local_30 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &in_RDI[1].super_HighFreqSub.dt.name._M_string_length);
    if (sVar3 <= local_30) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[1].super_HighFreqSub.dt.name._M_string_length,(ulong)local_30);
    __first = psVar2 + 2 + *pvVar4;
    __result = psVar2 + 2;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[1].super_HighFreqSub.dt.name._M_string_length,(ulong)local_30);
    __last = __result + *pvVar4;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)
               &in_RDI[1].super_HighFreqSub.dt.name._M_string_length,(ulong)(local_30 + 1));
    std::copy<short*,short*>(__first,__last,__result);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)
               &in_RDI[1].super_HighFreqSub.dt.name._M_string_length,(ulong)(local_30 + 1));
    local_30 = local_30 + 2;
  }
  puVar5 = (uint *)std::vector<short,_std::allocator<short>_>::data
                             ((vector<short,_std::allocator<short>_> *)0x1cf18c);
  uVar1 = *puVar5;
  iVar6 = HFSubConsumer::lastSysTimestamp(in_RDI);
  tVar7._4_4_ = 0;
  tVar7.trodes_timestamp = uVar1;
  tVar7.system_timestamp = iVar6;
  return tVar7;
}

Assistant:

timestamp_t NeuralConsumer::getData(int16_t *dest){
    readData(tempinput.data(), tempinput.size()*sizeof(int16_t));
    int16_t *src = tempinput.data() + sizeof(uint32_t)/sizeof(int16_t); //timestamp is first
    int offset = 0;
//     for(const auto &i : args.indices){
//         //i is the ith channel. so i*sizeof(int16_t) is the offset after the first one.
// //        memcpy(dst+offset, src + i*sizeof(int16_t), sizeof(int16_t));
//         dest[offset] = *(int16_t*)(src+i*sizeof(int16_t));
//         offset++;
//     }
    for(unsigned int i = 0; i < args.indices.size(); i+=2){
        std::copy(src+args.indices[i], src+args.indices[i]+args.indices[i+1], dest+offset);
        offset += args.indices[i+1];
    }
    return {*(uint32_t*)tempinput.data(), lastSysTimestamp()}; //Timestamp at beginning of packet
}